

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O3

Emb_Obj_t * Emb_ManPerformBfs(Emb_Man_t *p,Vec_Int_t *vThis,Vec_Int_t *vNext,Emb_Dat_t *pDist)

{
  uint *puVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  Vec_Int_t *p_00;
  ulong uVar8;
  int iVar9;
  int *piVar10;
  int *piVar11;
  long lVar12;
  
  iVar9 = vThis->nSize;
  if (iVar9 < 1) {
    __assert_fail("Vec_IntSize(vThis) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                  ,0x3a7,
                  "Emb_Obj_t *Emb_ManPerformBfs(Emb_Man_t *, Vec_Int_t *, Vec_Int_t *, Emb_Dat_t *)"
                 );
  }
  iVar4 = 0;
  p->nDistMax = 0;
  p->nReached = p->nReached + iVar9;
  vNext->nSize = 0;
  if (0 < vThis->nSize) {
    piVar3 = &vNext->nSize;
    piVar11 = &vThis->nSize;
    do {
      piVar10 = piVar3;
      p_00 = vNext;
      lVar12 = 0;
      do {
        if (p->pObjData == (int *)0x0) break;
        puVar1 = (uint *)(p->pObjData + (uint)vThis->pArray[lVar12]);
        if (pDist != (Emb_Dat_t *)0x0) {
          pDist[puVar1[4]] = (float)p->nDistMax;
        }
        uVar5 = *puVar1;
        if (0xf < uVar5) {
          uVar8 = 0;
          do {
            lVar6 = (long)(int)puVar1[uVar8 + 5];
            if (puVar1[3 - lVar6] != p->nTravIds) {
              puVar1[3 - lVar6] = p->nTravIds;
              Vec_IntPush(p_00,puVar1[2 - lVar6]);
              uVar5 = *puVar1;
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 < uVar5 >> 4);
        }
        uVar5 = puVar1[1];
        if (0 < (int)uVar5) {
          lVar6 = 0;
          do {
            lVar7 = (long)(int)puVar1[(ulong)(*puVar1 >> 4) + lVar6 + 5];
            if (puVar1[lVar7 + 3] != p->nTravIds) {
              puVar1[lVar7 + 3] = p->nTravIds;
              Vec_IntPush(p_00,puVar1[lVar7 + 2]);
              uVar5 = puVar1[1];
            }
            lVar6 = lVar6 + 1;
          } while ((int)lVar6 < (int)uVar5);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < *piVar11);
      iVar9 = p->nDistMax;
      iVar2 = *piVar10;
      iVar4 = iVar9 + 1;
      p->nDistMax = iVar4;
      if (iVar2 < 1) goto LAB_0068d50c;
      p->nReached = p->nReached + iVar2;
      vThis->nSize = 0;
      vNext = vThis;
      piVar3 = &vThis->nSize;
      piVar11 = piVar10;
      vThis = p_00;
    } while (0 < *piVar10);
  }
  p->nDistMax = iVar4 + 1;
  iVar9 = iVar4;
LAB_0068d50c:
  if (vThis->nSize < 1) {
    __assert_fail("Vec_IntSize(vNext) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                  ,0x3c0,
                  "Emb_Obj_t *Emb_ManPerformBfs(Emb_Man_t *, Vec_Int_t *, Vec_Int_t *, Emb_Dat_t *)"
                 );
  }
  if ((pDist != (Emb_Dat_t *)0x0) &&
     ((pDist[(((Emb_Obj_t *)(p->pObjData + (uint)*vThis->pArray))->field_8).Value] != (float)iVar9
      || (NAN(pDist[(((Emb_Obj_t *)(p->pObjData + (uint)*vThis->pArray))->field_8).Value]) ||
          NAN((float)iVar9))))) {
    __assert_fail("pDist == NULL || pDist[pResult->Value] == p->nDistMax - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                  ,0x3c2,
                  "Emb_Obj_t *Emb_ManPerformBfs(Emb_Man_t *, Vec_Int_t *, Vec_Int_t *, Emb_Dat_t *)"
                 );
  }
  return (Emb_Obj_t *)(p->pObjData + (uint)*vThis->pArray);
}

Assistant:

Emb_Obj_t * Emb_ManPerformBfs( Emb_Man_t * p, Vec_Int_t * vThis, Vec_Int_t * vNext, Emb_Dat_t * pDist )
{
    Vec_Int_t * vTemp;
    Emb_Obj_t * pThis, * pNext, * pResult;
    int i, k;
    assert( Vec_IntSize(vThis) > 0 );
    for ( p->nDistMax = 0; Vec_IntSize(vThis) > 0; p->nDistMax++ )
    {
        p->nReached += Vec_IntSize(vThis);
        Vec_IntClear( vNext );
        Emb_ManForEachObjVec( vThis, p, pThis, i )
        {
            if ( pDist ) pDist[pThis->Value] = p->nDistMax;
            Emb_ObjForEachFanin( pThis, pNext, k )
            {
                if ( Emb_ObjIsTravIdCurrent(p, pNext) )
                    continue;
                Emb_ObjSetTravIdCurrent(p, pNext);
                Vec_IntPush( vNext, pNext->hHandle );
            }
            Emb_ObjForEachFanout( pThis, pNext, k )
            {
                if ( Emb_ObjIsTravIdCurrent(p, pNext) )
                    continue;
                Emb_ObjSetTravIdCurrent(p, pNext);
                Vec_IntPush( vNext, pNext->hHandle );
            }
        }
        vTemp = vThis; vThis = vNext; vNext = vTemp;
    }
    assert( Vec_IntSize(vNext) > 0 );
    pResult = Emb_ManObj( p, Vec_IntEntry(vNext, 0) );
    assert( pDist == NULL || pDist[pResult->Value] == p->nDistMax - 1 );
    return pResult;
}